

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void skewness_double_suite::test_exponential_increase(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  close_to<double> predicate_09;
  close_to<double> predicate_10;
  close_to<double> predicate_11;
  close_to<double> predicate_12;
  close_to<double> predicate_13;
  close_to<double> predicate_14;
  close_to<double> predicate_15;
  close_to<double> predicate_16;
  close_to<double> predicate_17;
  close_to<double> predicate_18;
  close_to<double> predicate_19;
  close_to<double> predicate_20;
  close_to<double> predicate_21;
  close_to<double> predicate_22;
  close_to<double> predicate_23;
  close_to<double> predicate_24;
  close_to<double> predicate_25;
  close_to<double> predicate_26;
  close_to<double> predicate_27;
  double absolute_tolerance;
  double *in_stack_fffffffffffffbe8;
  double local_408;
  value_type local_400;
  value_type local_3f8;
  double local_3e8;
  value_type local_3e0;
  value_type local_3d8;
  double local_3c8;
  value_type local_3c0;
  value_type local_3b8;
  double local_3a8;
  value_type local_3a0;
  value_type local_398;
  double local_388;
  value_type local_380;
  value_type local_378;
  double local_368;
  value_type local_360;
  value_type local_358;
  double local_348;
  value_type local_340;
  value_type local_338;
  double local_328;
  value_type local_320;
  value_type local_318;
  double local_308;
  value_type local_300;
  value_type local_2f8;
  double local_2e8;
  value_type local_2e0;
  value_type local_2d8;
  double local_2c8;
  value_type local_2c0;
  value_type local_2b8;
  double local_2a8;
  value_type local_2a0;
  value_type local_298;
  double local_288;
  value_type local_280;
  value_type local_278;
  double local_268;
  value_type local_260;
  value_type local_258;
  double local_248;
  value_type local_240;
  value_type local_238;
  double local_228;
  value_type local_220;
  value_type local_218;
  double local_208;
  value_type local_200;
  value_type local_1f8;
  double local_1e8;
  value_type local_1e0;
  value_type local_1d8;
  double local_1c8;
  value_type local_1c0;
  value_type local_1b8;
  double local_1a8;
  value_type local_1a0;
  value_type local_198;
  double local_188;
  value_type local_180;
  value_type local_178;
  double local_168;
  value_type local_160;
  value_type local_158;
  double local_148;
  value_type local_140;
  value_type local_138;
  double local_128;
  value_type local_120;
  value_type local_118;
  double local_108;
  value_type local_100;
  value_type local_f8;
  double local_e8;
  value_type local_e0;
  value_type local_d8;
  double local_c8;
  value_type local_c0;
  value_type local_b8;
  double local_a8;
  value_type local_a0;
  value_type local_98;
  double local_88;
  value_type local_80 [4];
  undefined1 local_60 [8];
  moment_skewness<double> filter;
  close_to<double> tolerance;
  
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)&filter.sum,1e-05,absolute_tolerance);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::basic_moment
            ((basic_moment<double,_(trial::online::with)3> *)local_60,0.125,0.25,0.25);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push
            ((basic_moment<double,_(trial::online::with)3> *)local_60,1.0);
  local_80[2] = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                          ((basic_moment<double,_(trial::online::with)1> *)local_60);
  local_80[1] = 1.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x237,"void skewness_double_suite::test_exponential_increase()",local_80 + 2,
             local_80 + 1);
  local_80[0] = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                          ((basic_moment<double,_(trial::online::with)2> *)local_60);
  local_88 = 0.0;
  local_98 = filter.sum.skewness;
  predicate_27.absolute = tolerance.relative;
  predicate_27.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x238,0x111baa,(char *)local_80,&local_88,in_stack_fffffffffffffbe8,
             predicate_27);
  local_a0 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                       ((basic_moment<double,_(trial::online::with)3> *)local_60);
  local_a8 = 0.0;
  local_b8 = filter.sum.skewness;
  predicate_26.absolute = tolerance.relative;
  predicate_26.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x239,0x111baa,(char *)&local_a0,&local_a8,in_stack_fffffffffffffbe8,
             predicate_26);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push
            ((basic_moment<double,_(trial::online::with)3> *)local_60,10.0);
  local_c0 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                       ((basic_moment<double,_(trial::online::with)1> *)local_60);
  local_c8 = 5.8;
  local_d8 = filter.sum.skewness;
  predicate_25.absolute = tolerance.relative;
  predicate_25.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.8","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x23b,0x111baa,(char *)&local_c0,&local_c8,in_stack_fffffffffffffbe8,
             predicate_25);
  local_e0 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                       ((basic_moment<double,_(trial::online::with)2> *)local_60);
  local_e8 = 10.08;
  local_f8 = filter.sum.skewness;
  predicate_24.absolute = tolerance.relative;
  predicate_24.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","10.08","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x23c,0x111baa,(char *)&local_e0,&local_e8,in_stack_fffffffffffffbe8,
             predicate_24);
  local_100 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_60);
  local_108 = 1.32288;
  local_118 = filter.sum.skewness;
  predicate_23.absolute = tolerance.relative;
  predicate_23.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.32288","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x23d,0x111baa,(char *)&local_100,&local_108,in_stack_fffffffffffffbe8,
             predicate_23);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push
            ((basic_moment<double,_(trial::online::with)3> *)local_60,100.0);
  local_120 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_60);
  local_128 = 41.4734;
  local_138 = filter.sum.skewness;
  predicate_22.absolute = tolerance.relative;
  predicate_22.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","41.4734","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x23f,0x111baa,(char *)&local_120,&local_128,in_stack_fffffffffffffbe8,
             predicate_22);
  local_140 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_60);
  local_148 = 1486.96;
  local_158 = filter.sum.skewness;
  predicate_21.absolute = tolerance.relative;
  predicate_21.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1486.96","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x240,0x111baa,(char *)&local_140,&local_148,in_stack_fffffffffffffbe8,
             predicate_21);
  local_160 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_60);
  local_168 = 1.51234;
  local_178 = filter.sum.skewness;
  predicate_20.absolute = tolerance.relative;
  predicate_20.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.51234","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x241,0x111baa,(char *)&local_160,&local_168,in_stack_fffffffffffffbe8,
             predicate_20);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push
            ((basic_moment<double,_(trial::online::with)3> *)local_60,1000.0);
  local_180 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_60);
  local_188 = 331.01;
  local_198 = filter.sum.skewness;
  predicate_19.absolute = tolerance.relative;
  predicate_19.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","331.01","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x243,0x111baa,(char *)&local_180,&local_188,in_stack_fffffffffffffbe8,
             predicate_19);
  local_1a0 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_60);
  local_1a8 = 164617.0;
  local_1b8 = filter.sum.skewness;
  predicate_18.absolute = tolerance.relative;
  predicate_18.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","164617.","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x244,0x111baa,(char *)&local_1a0,&local_1a8,in_stack_fffffffffffffbe8,
             predicate_18);
  local_1c0 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_60);
  local_1c8 = 1.64023;
  local_1d8 = filter.sum.skewness;
  predicate_17.absolute = tolerance.relative;
  predicate_17.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.64023","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x245,0x111baa,(char *)&local_1c0,&local_1c8,in_stack_fffffffffffffbe8,
             predicate_17);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push
            ((basic_moment<double,_(trial::online::with)3> *)local_60,10000.0);
  local_1e0 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_60);
  local_1e8 = 2812.32;
  local_1f8 = filter.sum.skewness;
  predicate_16.absolute = tolerance.relative;
  predicate_16.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2812.32","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x247,0x111baa,(char *)&local_1e0,&local_1e8,in_stack_fffffffffffffbe8,
             predicate_16);
  local_200 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_60);
  local_208 = 17044900.0;
  local_218 = filter.sum.skewness;
  predicate_15.absolute = tolerance.relative;
  predicate_15.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.70449e7","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x248,0x111baa,(char *)&local_200,&local_208,in_stack_fffffffffffffbe8,
             predicate_15);
  local_220 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_60);
  local_228 = 1.73071;
  local_238 = filter.sum.skewness;
  predicate_14.absolute = tolerance.relative;
  predicate_14.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.73071","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x249,0x111baa,(char *)&local_220,&local_228,in_stack_fffffffffffffbe8,
             predicate_14);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push
            ((basic_moment<double,_(trial::online::with)3> *)local_60,100000.0);
  local_240 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_60);
  local_248 = 24852.2;
  local_258 = filter.sum.skewness;
  predicate_13.absolute = tolerance.relative;
  predicate_13.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","24852.2","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x24b,0x111baa,(char *)&local_240,&local_248,in_stack_fffffffffffffbe8,
             predicate_13);
  local_260 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_60);
  local_268 = 1729330000.0;
  local_278 = filter.sum.skewness;
  predicate_12.absolute = tolerance.relative;
  predicate_12.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.72933e9","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x24c,0x111baa,(char *)&local_260,&local_268,in_stack_fffffffffffffbe8,
             predicate_12);
  local_280 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_60);
  local_288 = 1.79586;
  local_298 = filter.sum.skewness;
  predicate_11.absolute = tolerance.relative;
  predicate_11.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.79586","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x24d,0x111baa,(char *)&local_280,&local_288,in_stack_fffffffffffffbe8,
             predicate_11);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push
            ((basic_moment<double,_(trial::online::with)3> *)local_60,1000000.0);
  local_2a0 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_60);
  local_2a8 = 225565.0;
  local_2b8 = filter.sum.skewness;
  predicate_10.absolute = tolerance.relative;
  predicate_10.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","225565.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x24f,0x111baa,(char *)&local_2a0,&local_2a8,in_stack_fffffffffffffbe8,
             predicate_10);
  local_2c0 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_60);
  local_2c8 = 174265000000.0;
  local_2d8 = filter.sum.skewness;
  predicate_09.absolute = tolerance.relative;
  predicate_09.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.74265e11","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x250,0x111baa,(char *)&local_2c0,&local_2c8,in_stack_fffffffffffffbe8,
             predicate_09);
  local_2e0 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_60);
  local_2e8 = 1.84332;
  local_2f8 = filter.sum.skewness;
  predicate_08.absolute = tolerance.relative;
  predicate_08.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.84332","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x251,0x111baa,(char *)&local_2e0,&local_2e8,in_stack_fffffffffffffbe8,
             predicate_08);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push
            ((basic_moment<double,_(trial::online::with)3> *)local_60,10000000.0);
  local_300 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_60);
  local_308 = 2086960.0;
  local_318 = filter.sum.skewness;
  predicate_07.absolute = tolerance.relative;
  predicate_07.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2.08696e6","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x253,0x111baa,(char *)&local_300,&local_308,in_stack_fffffffffffffbe8,
             predicate_07);
  local_320 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_60);
  local_328 = 17521400000000.0;
  local_338 = filter.sum.skewness;
  predicate_06.absolute = tolerance.relative;
  predicate_06.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.75214e13","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x254,0x111baa,(char *)&local_320,&local_328,in_stack_fffffffffffffbe8,
             predicate_06);
  local_340 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_60);
  local_348 = 1.87816;
  local_358 = filter.sum.skewness;
  predicate_05.absolute = tolerance.relative;
  predicate_05.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.87816","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x255,0x111baa,(char *)&local_340,&local_348,in_stack_fffffffffffffbe8,
             predicate_05);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push
            ((basic_moment<double,_(trial::online::with)3> *)local_60,100000000.0);
  local_360 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_60);
  local_368 = 19587900.0;
  local_378 = filter.sum.skewness;
  predicate_04.absolute = tolerance.relative;
  predicate_04.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.95879e7","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x257,0x111baa,(char *)&local_360,&local_368,in_stack_fffffffffffffbe8,
             predicate_04);
  local_380 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_60);
  local_388 = 1.76054e+15;
  local_398 = filter.sum.skewness;
  predicate_03.absolute = tolerance.relative;
  predicate_03.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.76054e15","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x258,0x111baa,(char *)&local_380,&local_388,in_stack_fffffffffffffbe8,
             predicate_03);
  local_3a0 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_60);
  local_3a8 = 1.9039;
  local_3b8 = filter.sum.skewness;
  predicate_02.absolute = tolerance.relative;
  predicate_02.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.9039","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x259,0x111baa,(char *)&local_3a0,&local_3a8,in_stack_fffffffffffffbe8,
             predicate_02);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push
            ((basic_moment<double,_(trial::online::with)3> *)local_60,1000000000.0);
  local_3c0 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_60);
  local_3c8 = 185889000.0;
  local_3d8 = filter.sum.skewness;
  predicate_01.absolute = tolerance.relative;
  predicate_01.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.85889e8","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x25b,0x111baa,(char *)&local_3c0,&local_3c8,in_stack_fffffffffffffbe8,
             predicate_01);
  local_3e0 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_60);
  local_3e8 = 1.76876e+17;
  local_3f8 = filter.sum.skewness;
  predicate_00.absolute = tolerance.relative;
  predicate_00.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.76876e17","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x25c,0x111baa,(char *)&local_3e0,&local_3e8,in_stack_fffffffffffffbe8,
             predicate_00);
  local_400 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_60);
  local_408 = 1.92298;
  predicate.absolute = tolerance.relative;
  predicate.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.92298","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x25d,0x111baa,(char *)&local_400,&local_408,(double *)filter.sum.skewness,
             predicate);
  return;
}

Assistant:

void test_exponential_increase()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    decay::moment_skewness<double> filter(one_over_eight, one_over_four, one_over_four);

    filter.push(1e0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    TRIAL_TEST_WITH(filter.variance(), 0.0, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 0.0, tolerance);
    filter.push(1e1);
    TRIAL_TEST_WITH(filter.mean(), 5.8, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 10.08, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.32288, tolerance);
    filter.push(1e2);
    TRIAL_TEST_WITH(filter.mean(), 41.4734, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1486.96, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.51234, tolerance);
    filter.push(1e3);
    TRIAL_TEST_WITH(filter.mean(), 331.01, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 164617., tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.64023, tolerance);
    filter.push(1e4);
    TRIAL_TEST_WITH(filter.mean(), 2812.32, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.70449e7, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.73071, tolerance);
    filter.push(1e5);
    TRIAL_TEST_WITH(filter.mean(), 24852.2, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.72933e9, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.79586, tolerance);
    filter.push(1e6);
    TRIAL_TEST_WITH(filter.mean(), 225565.0, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.74265e11, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.84332, tolerance);
    filter.push(1e7);
    TRIAL_TEST_WITH(filter.mean(), 2.08696e6, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.75214e13, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.87816, tolerance);
    filter.push(1e8);
    TRIAL_TEST_WITH(filter.mean(), 1.95879e7, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.76054e15, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.9039, tolerance);
    filter.push(1e9);
    TRIAL_TEST_WITH(filter.mean(), 1.85889e8, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.76876e17, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.92298, tolerance);
}